

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int ImGui::DataTypeFormatString
              (char *buf,int buf_size,ImGuiDataType data_type,void *p_data,char *format)

{
  float *in_RCX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  char *in_R8;
  int local_4;
  
  if ((in_EDX == 4) || (in_EDX == 5)) {
    local_4 = ImFormatString(in_RDI,(long)in_ESI,in_R8,(ulong)(uint)*in_RCX);
  }
  else if ((in_EDX == 6) || (in_EDX == 7)) {
    local_4 = ImFormatString(in_RDI,(long)in_ESI,in_R8,*(undefined8 *)in_RCX);
  }
  else if (in_EDX == 8) {
    local_4 = ImFormatString((char *)(double)*in_RCX,(size_t)in_RDI,(char *)(long)in_ESI,in_R8);
  }
  else if (in_EDX == 9) {
    local_4 = ImFormatString(*(char **)in_RCX,(size_t)in_RDI,(char *)(long)in_ESI,in_R8);
  }
  else if (in_EDX == 0) {
    local_4 = ImFormatString(in_RDI,(long)in_ESI,in_R8,(ulong)(uint)(int)*(char *)in_RCX);
  }
  else if (in_EDX == 1) {
    local_4 = ImFormatString(in_RDI,(long)in_ESI,in_R8,(ulong)*(byte *)in_RCX);
  }
  else if (in_EDX == 2) {
    local_4 = ImFormatString(in_RDI,(long)in_ESI,in_R8,(ulong)(uint)(int)*(short *)in_RCX);
  }
  else {
    if (in_EDX != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                    ,0x6d2,
                    "int ImGui::DataTypeFormatString(char *, int, ImGuiDataType, const void *, const char *)"
                   );
    }
    local_4 = ImFormatString(in_RDI,(long)in_ESI,in_R8,(ulong)*(ushort *)in_RCX);
  }
  return local_4;
}

Assistant:

int ImGui::DataTypeFormatString(char* buf, int buf_size, ImGuiDataType data_type, const void* p_data, const char* format)
{
    // Signedness doesn't matter when pushing integer arguments
    if (data_type == ImGuiDataType_S32 || data_type == ImGuiDataType_U32)
        return ImFormatString(buf, buf_size, format, *(const ImU32*)p_data);
    if (data_type == ImGuiDataType_S64 || data_type == ImGuiDataType_U64)
        return ImFormatString(buf, buf_size, format, *(const ImU64*)p_data);
    if (data_type == ImGuiDataType_Float)
        return ImFormatString(buf, buf_size, format, *(const float*)p_data);
    if (data_type == ImGuiDataType_Double)
        return ImFormatString(buf, buf_size, format, *(const double*)p_data);
    if (data_type == ImGuiDataType_S8)
        return ImFormatString(buf, buf_size, format, *(const ImS8*)p_data);
    if (data_type == ImGuiDataType_U8)
        return ImFormatString(buf, buf_size, format, *(const ImU8*)p_data);
    if (data_type == ImGuiDataType_S16)
        return ImFormatString(buf, buf_size, format, *(const ImS16*)p_data);
    if (data_type == ImGuiDataType_U16)
        return ImFormatString(buf, buf_size, format, *(const ImU16*)p_data);
    IM_ASSERT(0);
    return 0;
}